

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __thiscall
node::anon_unknown_2::ChainImpl::handleRpc(ChainImpl *this,CRPCCommand *command)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  CRPCCommand *in_RDX;
  long in_FS_OFFSET;
  _Any_data __tmp;
  undefined8 local_58;
  _func_int *p_Stack_50;
  _func_int *local_48;
  _func_int *local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pp_Var2 = (_func_int **)operator_new(0x90);
  *pp_Var2 = (_func_int *)&PTR__RpcHandlerImpl_00afd5b0;
  CRPCCommand::CRPCCommand((CRPCCommand *)(pp_Var2 + 1),in_RDX);
  pp_Var2[0x11] = (_func_int *)in_RDX;
  local_58._0_4_ = SUB84(pp_Var2,0);
  local_58._4_4_ = (undefined4)((ulong)pp_Var2 >> 0x20);
  local_38 = (undefined4)local_58;
  uStack_34 = local_58._4_4_;
  uStack_30 = 0;
  uStack_2c = 0;
  p_Var1 = pp_Var2[9];
  p_Stack_50 = pp_Var2[10];
  *(undefined4 *)(pp_Var2 + 9) = (undefined4)local_58;
  *(undefined4 *)((long)pp_Var2 + 0x4c) = local_58._4_4_;
  *(undefined4 *)(pp_Var2 + 10) = 0;
  *(undefined4 *)((long)pp_Var2 + 0x54) = 0;
  local_48 = pp_Var2[0xb];
  pp_Var2[0xb] = std::
                 _Function_handler<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/interfaces.cpp:507:27)>
                 ::_M_manager;
  local_40 = pp_Var2[0xc];
  pp_Var2[0xc] = std::
                 _Function_handler<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/interfaces.cpp:507:27)>
                 ::_M_invoke;
  local_58 = p_Var1;
  if (local_48 != (_func_int *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  CRPCTable::appendCommand(&tableRPC,(string *)(pp_Var2 + 5),(CRPCCommand *)(pp_Var2 + 1));
  (this->super_Chain)._vptr_Chain = pp_Var2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Handler> handleRpc(const CRPCCommand& command) override
    {
        return std::make_unique<RpcHandlerImpl>(command);
    }